

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPubKeys
          (LegacyScriptPubKeyMan *this,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *key_origins,bool add_keypool,int64_t timestamp)

{
  pointer ppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  _Rep_type *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  undefined3 in_register_00000081;
  undefined4 uVar10;
  CPubKey *pubKey;
  _Rb_tree_header *p_Var11;
  pointer __k;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  CPubKey temp;
  undefined1 in_stack_fffffffffffffef8 [12];
  WalletBatch local_d0;
  direct_or_indirect local_c0;
  uint local_a4;
  string local_a0;
  byte local_79 [65];
  long local_38;
  WalletDatabase *pWVar5;
  
  uVar10 = CONCAT31(in_register_00000081,add_keypool);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
  (*pWVar5->_vptr_WalletDatabase[0xe])(&local_d0,pWVar5,1);
  p_Var6 = (key_origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(key_origins->_M_t)._M_impl.super__Rb_tree_header;
  local_d0.m_database = pWVar5;
  if ((_Rb_tree_header *)p_Var6 != p_Var11) {
    do {
      AddKeyOriginWithDB(this,&local_d0,(CPubKey *)&p_Var6[1]._M_right,(KeyOriginInfo *)(p_Var6 + 4)
                        );
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var11);
  }
  __k = (ordered_pubkeys->
        super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (ordered_pubkeys->
           super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  if (__k != ppVar1) {
    p_Var2 = (_Rep_type *)&(pubkey_map->_M_t)._M_impl;
    do {
      cVar7 = std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
              ::find(&pubkey_map->_M_t,&__k->first);
      if ((_Rb_tree_header *)cVar7._M_node != &(p_Var2->_M_impl).super__Rb_tree_header) {
        local_79[0] = 0xff;
        iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                          (this,__k,local_79);
        if ((char)iVar4 == '\0') {
          pubKey = (CPubKey *)((long)&cVar7._M_node[1]._M_left + 4);
          GetScriptForRawPubKey((CScript *)&local_c0.indirect_contents,pubKey);
          bVar3 = AddWatchOnlyWithDB(this,&local_d0,(CScript *)&local_c0.indirect_contents,timestamp
                                    );
          if (0x1c < local_a4) {
            free(local_c0.indirect_contents.indirect);
          }
          if (!bVar3) {
            bVar3 = false;
            goto LAB_0021d6ab;
          }
          pmVar8 = std::
                   map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                   ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&__k->first);
          pmVar8->nCreateTime = timestamp;
          if ((char)uVar10 != '\0') {
            AddKeypoolPubkeyWithDB(this,pubKey,__k->second,&local_d0);
            boost::signals2::
            signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
            ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                          NotifyCanGetAddressesChanged);
          }
        }
        else {
          sVar9 = 0x21;
          if ((local_79[0] & 0xfe) != 2) {
            if ((byte)(local_79[0] - 4) < 4) {
              sVar9 = *(size_t *)(&DAT_004a5780 + (ulong)(byte)(local_79[0] - 4) * 8);
            }
            else {
              sVar9 = 0;
            }
          }
          s.m_size = sVar9;
          s.m_data = local_79;
          HexStr_abi_cxx11_(&local_a0,s);
          parameters._M_string_length._4_4_ = uVar10;
          parameters._0_12_ = in_stack_fffffffffffffef8;
          parameters.field_2._M_allocated_capacity = timestamp;
          parameters.field_2._8_8_ = pubkey_map;
          ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                    ((ScriptPubKeyMan *)this,"Already have pubkey %s, skipping\n",parameters);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      __k = __k + 1;
    } while (__k != ppVar1);
    bVar3 = true;
  }
LAB_0021d6ab:
  if (local_d0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_d0.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPubKeys(const std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys, const std::map<CKeyID, CPubKey>& pubkey_map, const std::map<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& key_origins, const bool add_keypool, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : key_origins) {
        AddKeyOriginWithDB(batch, entry.second.first, entry.second.second);
    }
    for (const auto& [id, internal] : ordered_pubkeys) {
        auto entry = pubkey_map.find(id);
        if (entry == pubkey_map.end()) {
            continue;
        }
        const CPubKey& pubkey = entry->second;
        CPubKey temp;
        if (GetPubKey(id, temp)) {
            // Already have pubkey, skipping
            WalletLogPrintf("Already have pubkey %s, skipping\n", HexStr(temp));
            continue;
        }
        if (!AddWatchOnlyWithDB(batch, GetScriptForRawPubKey(pubkey), timestamp)) {
            return false;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;

        // Add to keypool only works with pubkeys
        if (add_keypool) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
            NotifyCanGetAddressesChanged();
        }
    }
    return true;
}